

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SubDEdgePtr *unsorted_edges,uint unsorted_edge_count,
               ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges)

{
  uint uVar1;
  ON_SimpleArray<ON_SubDEdgePtr> local_unsorted_edges;
  ON_SimpleArray<ON_SubDEdgePtr> local_28;
  
  uVar1 = 0;
  if (unsorted_edge_count - 1 < 0xfffffffe && unsorted_edges != (ON_SubDEdgePtr *)0x0) {
    if (((long)sorted_edges->m_capacity < 1) ||
       (sorted_edges->m_a + sorted_edges->m_capacity <= unsorted_edges ||
        unsorted_edges < sorted_edges->m_a)) {
      uVar1 = Internal_MuchImprovedSortEdgesIntoChains
                        (&unsorted_edges->m_ptr,(ulong)unsorted_edge_count,sorted_edges);
      return uVar1;
    }
    local_28._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00816d78;
    local_28.m_a = (ON_SubDEdgePtr *)0x0;
    local_28.m_count = 0;
    local_28.m_capacity = 0;
    ON_SimpleArray<ON_SubDEdgePtr>::Append(&local_28,unsorted_edge_count,unsorted_edges);
    uVar1 = Internal_MuchImprovedSortEdgesIntoChains
                      (&(local_28.m_a)->m_ptr,local_28._16_8_ & 0xffffffff,sorted_edges);
    ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray(&local_28);
  }
  return uVar1;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SubDEdgePtr* unsorted_edges,
  unsigned unsorted_edge_count,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges
)
{
  unsigned int chain_count = 0;
  if (nullptr != unsorted_edges && unsorted_edge_count > 0 && unsorted_edge_count < ON_UNSET_UINT_INDEX)
  {
    if (sorted_edges.Capacity() > 0 && unsorted_edges >= sorted_edges.Array() && unsorted_edges < sorted_edges.Array() + sorted_edges.Capacity())
    {
      ON_SimpleArray< ON_SubDEdgePtr > local_unsorted_edges;
      local_unsorted_edges.Append(unsorted_edge_count, unsorted_edges);
      chain_count = Internal_MuchImprovedSortEdgesIntoChains(
        (const ON__UINT_PTR*)local_unsorted_edges.Array(),
        local_unsorted_edges.UnsignedCount(),
        sorted_edges
      );
    }
    else
    {
      chain_count = Internal_MuchImprovedSortEdgesIntoChains(
        (const ON__UINT_PTR*)unsorted_edges,
        unsorted_edge_count,
        sorted_edges
      );
    }
  }
  return chain_count;
}